

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShadingWriter.cpp
# Opt level: O3

EStatusCode __thiscall
ShadingWriter::WriteShadingPatternObjectWithPDFCustomFunctions
          (ShadingWriter *this,SweepShading *inSweepShading,PDFRectangle *inBounds,
          PDFMatrix *inMatrix,ObjectIDType inPatternObjectId)

{
  EStatusCode EVar1;
  PDFStream *this_00;
  IByteWriter *inStreamForWriting;
  PrimitiveObjectsWriter primitiveWriter;
  PDFMatrix patternProgramMatrix;
  PrimitiveObjectsWriter PStack_68;
  PDFMatrix local_60;
  
  PDFMatrix::PDFMatrix(&local_60,1.0,0.0,0.0,1.0,inSweepShading->cX,inSweepShading->cY);
  this_00 = StartCustomFunctionShadingPatternStream
                      (this,&local_60,inBounds,inMatrix,inPatternObjectId);
  if (this_00 == (PDFStream *)0x0) {
    EVar1 = eFailure;
  }
  else {
    inStreamForWriting = PDFStream::GetWriteStream(this_00);
    PrimitiveObjectsWriter::PrimitiveObjectsWriter(&PStack_68,inStreamForWriting);
    WriteGradientCustomFunctionProgram(this,inSweepShading,inStreamForWriting,&PStack_68);
    EVar1 = ObjectsContext::EndPDFStream(this->mObjectsContext,this_00);
    PrimitiveObjectsWriter::~PrimitiveObjectsWriter(&PStack_68);
    PDFStream::~PDFStream(this_00);
  }
  operator_delete(this_00,0xf0);
  PDFMatrix::~PDFMatrix(&local_60);
  return EVar1;
}

Assistant:

EStatusCode ShadingWriter::WriteShadingPatternObjectWithPDFCustomFunctions(
    const SweepShading& inSweepShading, 
    const PDFRectangle& inBounds,
    const PDFMatrix& inMatrix,
    ObjectIDType inPatternObjectId) {
    EStatusCode status = eSuccess;
    PDFStream* pdfStream = NULL;

    // apply transform matrix, to map pattern based on function range
    PDFMatrix patternProgramMatrix = PDFMatrix(1,0,0,1,inSweepShading.cX,inSweepShading.cY);

    do {
        pdfStream = StartCustomFunctionShadingPatternStream(patternProgramMatrix, inBounds, inMatrix, inPatternObjectId);
        if(!pdfStream) {
            status = eFailure;
            break;
        }

        IByteWriter* writeStream = pdfStream->GetWriteStream();
        PrimitiveObjectsWriter primitiveWriter(writeStream);
        WriteGradientCustomFunctionProgram(inSweepShading, writeStream, &primitiveWriter);
        status = mObjectsContext->EndPDFStream(pdfStream);
    } while(false);

    delete pdfStream;

    return status;
}